

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_Pair_resizeT(ImVector_Pair *self,int new_size,Pair v)

{
  ImGuiStoragePair *pIVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = self->Capacity;
  if (iVar4 < new_size) {
    if (iVar4 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar4 / 2 + iVar4;
    }
    if (iVar4 <= new_size) {
      iVar4 = new_size;
    }
    pIVar1 = (ImGuiStoragePair *)ImGui::MemAlloc((long)iVar4 << 4);
    if (self->Data != (ImGuiStoragePair *)0x0) {
      memcpy(pIVar1,self->Data,(long)self->Size << 4);
      ImGui::MemFree(self->Data);
    }
    self->Data = pIVar1;
    self->Capacity = iVar4;
  }
  iVar4 = self->Size;
  if (iVar4 < new_size) {
    lVar3 = (long)new_size - (long)iVar4;
    uVar2 = (long)iVar4 << 4 | 8;
    do {
      pIVar1 = self->Data;
      *(ImGuiID *)((long)pIVar1 + (uVar2 - 8)) = v.key;
      *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((long)&pIVar1->key + uVar2) = v.field_1;
      uVar2 = uVar2 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_Pair_resizeT(ImVector_Pair* self,int new_size,const Pair v)
{
    return self->resize(new_size,v);
}